

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::initSlowCase(APInt *this,uint64_t val,bool isSigned)

{
  uint uVar1;
  int iVar2;
  uint i;
  uint64_t *__s;
  ulong uVar3;
  APInt *pAVar4;
  ulong uVar5;
  
  uVar1 = this->BitWidth;
  uVar5 = (ulong)uVar1 + 0x3f >> 6;
  iVar2 = (int)uVar5;
  uVar3 = (ulong)(uint)(iVar2 * 8);
  __s = (uint64_t *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  (this->U).pVal = __s;
  *__s = val;
  if (((long)val < 0 && isSigned) && 0x40 < (ulong)uVar1) {
    uVar3 = 1;
    do {
      (this->U).pVal[uVar3] = 0xffffffffffffffff;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    __s = (this->U).pVal;
  }
  pAVar4 = (APInt *)(__s + (iVar2 - 1));
  if (uVar1 < 0x41) {
    pAVar4 = this;
  }
  (pAVar4->U).VAL = ((pAVar4->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return;
}

Assistant:

void APInt::initSlowCase(uint64_t val, bool isSigned) {
  U.pVal = getClearedMemory(getNumWords());
  U.pVal[0] = val;
  if (isSigned && int64_t(val) < 0)
    for (unsigned i = 1; i < getNumWords(); ++i)
      U.pVal[i] = WORD_MAX;
  clearUnusedBits();
}